

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomTwoAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomTwoAction::Go(GreenRoomTwoAction *this)

{
  itemType iVar1;
  ActionResults *this_00;
  string *this_01;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    this_00 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_38,"You go north.\n",&local_b9);
    ActionResults::ActionResults(this_00,G_ROOM4_KID,&local_38);
    this_01 = &local_38;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == SOUTH) {
      this_00 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string((string *)&local_58,"You go south.\n",&local_b9);
      ActionResults::ActionResults(this_00,G_ROOM3_BASIN,&local_58);
      this_01 = &local_58;
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      if (iVar1 == EAST) {
        this_00 = (ActionResults *)operator_new(0x30);
        std::__cxx11::string::string
                  ((string *)&local_78,"You go back to the boat room.\n",&local_b9);
        ActionResults::ActionResults(this_00,G_ROOM1_SIDE2,&local_78);
        this_01 = &local_78;
      }
      else {
        iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
        this_00 = (ActionResults *)operator_new(0x30);
        if (iVar1 == WEST) {
          std::__cxx11::string::string
                    ((string *)&local_98,"There is a wall, you can\'t go that way.\n",&local_b9);
          ActionResults::ActionResults(this_00,CURRENT,&local_98);
          this_01 = &local_98;
        }
        else {
          std::__cxx11::string::string((string *)&local_b8,"You can\'t go there.\n",&local_b9);
          ActionResults::ActionResults(this_00,CURRENT,&local_b8);
          this_01 = &local_b8;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)this_01);
  return this_00;
}

Assistant:

ActionResults *GreenRoomTwoAction::Go() {

    if (commands->getMainItem() == NORTH) {
        return new ActionResults(G_ROOM4_KID, "You go north.\n");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(G_ROOM3_BASIN, "You go south.\n");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(G_ROOM1_SIDE2, "You go back to the boat room.\n");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "There is a wall, you can't go that way.\n");
    }
    return new ActionResults(CURRENT,"You can't go there.\n");
}